

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# units.cpp
# Opt level: O0

void units::checkPowerOf10(string *unit_string)

{
  bool bVar1;
  int iVar2;
  ulong uVar3;
  char *pcVar4;
  long lVar5;
  out_of_range *anon_var_0;
  int power;
  undefined1 local_38 [8];
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> powerstr;
  size_type fndP;
  string *unit_string_local;
  
  powerstr.field_2._8_8_ = std::__cxx11::string::find((char *)unit_string,0x1ed133);
  do {
    if (powerstr.field_2._8_8_ == -1) {
      return;
    }
    uVar3 = std::__cxx11::string::size();
    if (powerstr.field_2._8_8_ + 3 < uVar3) {
      pcVar4 = (char *)std::__cxx11::string::operator[]((ulong)unit_string);
      bVar1 = isNumericalStartCharacter(*pcVar4);
      if (bVar1) {
        if (powerstr.field_2._8_8_ != 0) {
          pcVar4 = (char *)std::__cxx11::string::operator[]((ulong)unit_string);
          bVar1 = isNumericalCharacter(*pcVar4);
          if ((bVar1) &&
             ((((ulong)powerstr.field_2._8_8_ < 2 ||
               (pcVar4 = (char *)std::__cxx11::string::operator[]((ulong)unit_string),
               *pcVar4 != '.')) ||
              ((pcVar4 = (char *)std::__cxx11::string::operator[]((ulong)unit_string), '/' < *pcVar4
               && (pcVar4 = (char *)std::__cxx11::string::operator[]((ulong)unit_string),
                  *pcVar4 < ':')))))) goto LAB_001c1c4f;
        }
        std::__cxx11::string::substr((ulong)local_38,(ulong)unit_string);
        bVar1 = looksLikeInteger((string *)local_38);
        if (bVar1) {
          iVar2 = std::__cxx11::stoi((string *)local_38,(size_t *)0x0,10);
          lVar5 = (long)iVar2;
          if (lVar5 < 1) {
            lVar5 = -lVar5;
          }
          if (lVar5 < 0x27) {
            std::__cxx11::string::replace((ulong)unit_string,powerstr.field_2._8_8_,(char *)0x3);
          }
        }
        std::__cxx11::string::~string((string *)local_38);
      }
    }
LAB_001c1c4f:
    powerstr.field_2._8_8_ = std::__cxx11::string::find((char *)unit_string,0x1ed133);
  } while( true );
}

Assistant:

static void checkPowerOf10(std::string& unit_string)
{
    auto fndP = unit_string.find("10*");
    while (fndP != std::string::npos) {
        if (unit_string.size() > fndP + 3 &&
            isNumericalStartCharacter(unit_string[fndP + 3])) {
            if (fndP == 0 || !isNumericalCharacter(unit_string[fndP - 1]) ||
                (fndP >= 2 && unit_string[fndP - 1] == '.' &&
                 (unit_string[fndP - 2] < '0' ||
                  unit_string[fndP - 2] > '9'))) {
                auto powerstr = unit_string.substr(fndP + 3);
                if (looksLikeInteger(powerstr)) {
                    try {
                        int power = std::stoi(powerstr);
                        if (std::labs(power) <= 38) {
                            unit_string.replace(fndP, 3, "1e");
                        }
                    }
                    catch (const std::out_of_range&) {
                        // if it is a really big number we obviously skip it
                    }
                }
            }
        }
        fndP = unit_string.find("10*", fndP + 3);
    }
}